

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

TopologicalOrdersImpl<std::monostate> * __thiscall
wasm::TopologicalOrdersImpl<std::monostate>::operator++(TopologicalOrdersImpl<std::monostate> *this)

{
  pointer *ppSVar1;
  pointer pSVar2;
  iterator iVar3;
  Index extraout_var;
  fd_set *__writefds;
  Index extraout_EDX;
  fd_set *__readfds;
  pointer pSVar4;
  fd_set *in_R8;
  timeval *in_R9;
  _Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector> _Var5;
  _Storage<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true> local_48;
  Selector local_38;
  
  pSVar4 = (this->selectors).
           super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->selectors).
      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start != pSVar4) {
    do {
      _Var5 = (_Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>)
              Selector::advance(pSVar4 + -1,this);
      if ((_Var5._8_8_ >> 0x20 & 1) != 0) break;
      pSVar2 = (this->selectors).
               super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 = (this->selectors).
               super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->selectors).
      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
    } while (pSVar2 != pSVar4);
    _local_48 = _Var5;
    if ((_Var5._8_8_ >> 0x20 & 1) != 0) {
      iVar3._M_current =
           (this->selectors).
           super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(((long)iVar3._M_current -
                   (long)(this->selectors).
                         super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
          (ulong)(((long)(this->graph->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->graph->
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        if (iVar3._M_current ==
            (this->selectors).
            super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>>
          ::_M_realloc_insert<wasm::TopologicalOrdersImpl<std::monostate>::Selector_const&>
                    ((vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>>
                      *)&this->selectors,iVar3,&local_48._M_value);
        }
        else {
          local_48._M_value.index = _Var5._M_payload._8_4_;
          (iVar3._M_current)->index = local_48._M_value.index;
          local_48._0_8_ = _Var5._M_payload._0_8_;
          (iVar3._M_current)->start = local_48._0_4_;
          (iVar3._M_current)->count = local_48._M_value.count;
          ppSVar1 = &(this->selectors).
                     super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        while( true ) {
          pSVar4 = (this->selectors).
                   super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          __writefds = (fd_set *)
                       (((long)pSVar4 -
                         (long)(this->selectors).
                               super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555
                       );
          __readfds = (fd_set *)
                      (((long)(this->graph->
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->graph->
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                      );
          if (__readfds <= __writefds) break;
          local_38.start = Selector::select(pSVar4 + -1,(int)this,__readfds,__writefds,in_R8,in_R9);
          local_38.count = extraout_var;
          iVar3._M_current =
               (this->selectors).
               super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->selectors).
              super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
            ::_M_realloc_insert<wasm::TopologicalOrdersImpl<std::monostate>::Selector>
                      (&this->selectors,iVar3,&local_38);
          }
          else {
            (iVar3._M_current)->index = extraout_EDX;
            (iVar3._M_current)->start = local_38.start;
            (iVar3._M_current)->count = extraout_var;
            ppSVar1 = &(this->selectors).
                       super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
        }
        return this;
      }
      __assert_fail("selectors.size() < graph.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                    ,0x90,
                    "TopologicalOrdersImpl<F> &wasm::TopologicalOrdersImpl<>::operator++() [F = std::monostate]"
                   );
    }
  }
  if ((this->selectors).
      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->selectors).
      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return this;
  }
  __assert_fail("selectors.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0x8b,
                "TopologicalOrdersImpl<F> &wasm::TopologicalOrdersImpl<>::operator++() [F = std::monostate]"
               );
}

Assistant:

TopologicalOrdersImpl& operator++() {
    // Find the last selector that can be advanced, popping any that cannot.
    std::optional<Selector> next;
    while (!selectors.empty() && !(next = selectors.back().advance(*this))) {
      selectors.pop_back();
    }
    if (!next) {
      // No selector could be advanced, so we've seen every possible ordering.
      assert(selectors.empty());
      return *this;
    }
    // We've advanced the last selector on the stack, so initialize the
    // subsequent selectors.
    assert(selectors.size() < graph.size());
    selectors.push_back(*next);
    while (selectors.size() < graph.size()) {
      selectors.push_back(selectors.back().select(*this));
    }

    return *this;
  }